

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.cpp
# Opt level: O2

QDebug * __thiscall
QDebug::putTupleLikeImplImpl
          (QDebug *this,char *ns,char *what,size_t n,StreamTypeErased *ops,void **data)

{
  long lVar1;
  QDebug *pQVar2;
  size_t sVar3;
  long in_FS_OFFSET;
  QDebugStateSaver saver;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  saver.d._M_t.
  super___uniq_ptr_impl<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>._M_t
  .super__Tuple_impl<0UL,_QDebugStateSaverPrivate_*,_std::default_delete<QDebugStateSaverPrivate>_>.
  super__Head_base<0UL,_QDebugStateSaverPrivate_*,_false>._M_head_impl =
       (unique_ptr<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>)
       &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver(&saver,this);
  this->stream->space = false;
  if ((ns != (char *)0x0) && (*ns != '\0')) {
    pQVar2 = operator<<(this,ns);
    operator<<(pQVar2,"::");
  }
  pQVar2 = operator<<(this,what);
  operator<<(pQVar2,'(');
  for (sVar3 = 0; n != sVar3; sVar3 = sVar3 + 1) {
    (*ops[sVar3])(this,data[sVar3]);
    if (n - 1 != sVar3) {
      operator<<(this,", ");
    }
  }
  pQVar2 = operator<<(this,')');
  QDebugStateSaver::~QDebugStateSaver(&saver);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return pQVar2;
  }
  __stack_chk_fail();
}

Assistant:

QDebug &QDebug::putTupleLikeImplImpl(const char *ns, const char *what,
                                     size_t n, StreamTypeErased *ops, const void **data)
{
    const QDebugStateSaver saver(*this);
    nospace();
    if (ns && *ns)
        *this << ns << "::";
    *this << what << '(';
    while (n--) {
        (*ops++)(*this, *data++);
        if (n)
            *this << ", ";
    }
    return *this << ')';
}